

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.cpp
# Opt level: O0

MemoryStats * Jinx::GetMemoryStats(void)

{
  __int_type _Var1;
  MemoryStats *in_RDI;
  MemoryStats *stats;
  
  MemoryStats::MemoryStats(in_RDI);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&Mem::allocationCount)
  ;
  in_RDI->allocationCount = _Var1;
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&Mem::freeCount);
  in_RDI->freeCount = _Var1;
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&Mem::allocatedMemory)
  ;
  in_RDI->allocatedMemory = _Var1;
  return in_RDI;
}

Assistant:

inline_t MemoryStats GetMemoryStats()
	{
		MemoryStats stats;
		stats.allocationCount = Mem::allocationCount;
		stats.freeCount = Mem::freeCount;
		stats.allocatedMemory = Mem::allocatedMemory;
		return stats;
	}